

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O3

ByteData *
cfd::api::json::TransactionJsonApi::ConvertSignDataToSignature
          (ByteData *__return_storage_ptr__,string *hex_string,bool is_sign,bool is_der_encode,
          string *sighash_type,bool sighash_anyone_can_pay)

{
  pointer puVar1;
  CfdException *this;
  undefined3 in_register_00000009;
  undefined7 in_register_00000011;
  SigHashType sighashtype;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  TransactionJsonApi local_3c [12];
  
  cfd::core::ByteData::ByteData(__return_storage_ptr__);
  if (((uint)CONCAT71(in_register_00000011,is_sign) & CONCAT31(in_register_00000009,is_der_encode))
      == 1) {
    if (hex_string->_M_string_length == 0) {
      local_68._0_8_ = "cfd_json_transaction.cpp";
      local_68._8_4_ = 0xaa;
      local_58._M_allocated_capacity = 0x2698db;
      core::logger::log<>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,
                          "Failed to AddMultisigSign. sign hex empty.");
      this = (CfdException *)__cxa_allocate_exception(0x30);
      local_68._0_8_ = &local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Invalid hex string. empty sign hex.","");
      core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_68);
      __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    ConvertSigHashType(local_3c,sighash_type,sighash_anyone_can_pay);
    cfd::core::CryptoUtil::ConvertSignatureToDer((string *)local_68,(SigHashType *)hex_string);
  }
  else {
    if (hex_string->_M_string_length == 0) {
      return __return_storage_ptr__;
    }
    cfd::core::ByteData::ByteData((ByteData *)local_68,(string *)hex_string);
  }
  puVar1 = (__return_storage_ptr__->data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_68._0_8_;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._8_8_;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_58._M_allocated_capacity;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_58._M_allocated_capacity = 0;
  if ((puVar1 != (pointer)0x0) && (operator_delete(puVar1), (pointer)local_68._0_8_ != (pointer)0x0)
     ) {
    operator_delete((void *)local_68._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData TransactionJsonApi::ConvertSignDataToSignature(
    const std::string& hex_string, bool is_sign, bool is_der_encode,
    const std::string& sighash_type, bool sighash_anyone_can_pay) {
  ByteData byte_data;
  if (is_sign && is_der_encode) {
    if (hex_string.empty()) {
      warn(CFD_LOG_SOURCE, "Failed to AddMultisigSign. sign hex empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hex string. empty sign hex.");
    }
    SigHashType sighashtype = TransactionJsonApi::ConvertSigHashType(
        sighash_type, sighash_anyone_can_pay);
    byte_data = CryptoUtil::ConvertSignatureToDer(hex_string, sighashtype);
  } else if (hex_string.empty()) {
    // do nothing
  } else {
    byte_data = ByteData(hex_string);
  }
  return byte_data;
}